

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

vhost_fdt_hash_chain * mk_vhost_fdt_chain_lookup(uint hash,vhost_fdt_hash_table *ht)

{
  vhost_fdt_hash_chain *hc;
  int i;
  vhost_fdt_hash_table *ht_local;
  uint hash_local;
  
  hc._4_4_ = 0;
  while( true ) {
    if (7 < hc._4_4_) {
      return (vhost_fdt_hash_chain *)0x0;
    }
    if (ht->chain[hc._4_4_].hash == hash) break;
    hc._4_4_ = hc._4_4_ + 1;
  }
  return ht->chain + hc._4_4_;
}

Assistant:

static inline
struct vhost_fdt_hash_chain
*mk_vhost_fdt_chain_lookup(unsigned int hash, struct vhost_fdt_hash_table *ht)
{
    int i;
    struct vhost_fdt_hash_chain *hc = NULL;

    for (i = 0; i < VHOST_FDT_HASHTABLE_CHAINS; i++) {
        hc = &ht->chain[i];
        if (hc->hash == hash) {
            return hc;
        }
    }

    return NULL;
}